

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O1

void __thiscall
QPixmapColorizeFilter::QPixmapColorizeFilter(QPixmapColorizeFilter *this,QObject *parent)

{
  long lVar1;
  QPixmapColorizeFilterPrivate *d;
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0xa0);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QObjectPrivate_007fa4b8;
  *(undefined4 *)(this_00 + 0x7c) = 0;
  *(undefined2 *)(this_00 + 0x80) = 0xffff;
  *(undefined8 *)(this_00 + 0x82) = 0;
  QObject::QObject((QObject *)this,this_00,parent);
  *(undefined ***)&this->super_QPixmapFilter = &PTR_metaObject_007f9fa8;
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  *(undefined4 *)(lVar1 + 0x78) = 1;
  *(undefined ***)&this->super_QPixmapFilter = &PTR_metaObject_007fa128;
  *(undefined4 *)(lVar1 + 0x7c) = 1;
  *(undefined8 *)(lVar1 + 0x80) = 0xc0c000000000ffff;
  *(undefined2 *)(lVar1 + 0x88) = 0;
  *(undefined8 *)(lVar1 + 0x90) = 0x3ff0000000000000;
  *(uint *)(lVar1 + 0x98) = *(uint *)(lVar1 + 0x98) & 0xfffffffc | 1;
  return;
}

Assistant:

QPixmapColorizeFilter::QPixmapColorizeFilter(QObject *parent)
    : QPixmapFilter(*new QPixmapColorizeFilterPrivate, ColorizeFilter, parent)
{
    Q_D(QPixmapColorizeFilter);
    d->color = QColor(0, 0, 192);
    d->strength = qreal(1);
    d->opaque = true;
    d->alphaBlend = false;
}